

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mac_simple.c
# Opt level: O3

void mac_simple(ssh2_macalg *alg,ptrlen key,ptrlen data,void *output)

{
  ssh2_mac *psVar1;
  
  psVar1 = (*alg->new)(alg,(ssh_cipher *)0x0);
  (*psVar1->vt->setkey)(psVar1,key);
  (*psVar1->vt->start)(psVar1);
  BinarySink_put_datapl(psVar1->binarysink_,data);
  (*psVar1->vt->genresult)(psVar1,(uchar *)output);
  (*psVar1->vt->free)(psVar1);
  return;
}

Assistant:

void mac_simple(const ssh2_macalg *alg, ptrlen key, ptrlen data, void *output)
{
    ssh2_mac *mac = ssh2_mac_new(alg, NULL);
    ssh2_mac_setkey(mac, key);
    ssh2_mac_start(mac);
    put_datapl(mac, data);
    ssh2_mac_genresult(mac, output);
    ssh2_mac_free(mac);
}